

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O0

int list_first(ListNode *head,ListNode **output)

{
  int iVar1;
  char *in_RSI;
  unsigned_long in_RDI;
  ListNode *target_node;
  int in_stack_ffffffffffffffdc;
  undefined4 local_4;
  
  _assert_true(in_RDI,in_RSI,(char *)0x0,in_stack_ffffffffffffffdc);
  iVar1 = list_empty((ListNode *)0x16eb4e);
  if (iVar1 == 0) {
    *(undefined8 *)in_RSI = *(undefined8 *)(in_RDI + 0x10);
  }
  local_4 = (uint)(iVar1 == 0);
  return local_4;
}

Assistant:

static int list_first(ListNode * const head, ListNode **output) {
    ListNode *target_node = NULL;
    assert_non_null(head);
    if (list_empty(head)) {
        return 0;
    }
    target_node = head->next;
    *output = target_node;
    return 1;
}